

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2dae49::PpuTest_ignore_oamdata_write_background_enabled_Test::
~PpuTest_ignore_oamdata_write_background_enabled_Test
          (PpuTest_ignore_oamdata_write_background_enabled_Test *this)

{
  PpuTest_ignore_oamdata_write_background_enabled_Test *this_local;
  
  ~PpuTest_ignore_oamdata_write_background_enabled_Test(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

TEST_F(PpuTest, ignore_oamdata_write_background_enabled) {
    registers.mask = PpuMask(0b00001000);
    registers.oamaddr = 0x02;
    expected.mask = registers.mask;
    expected.oamaddr = registers.oamaddr;

    ppu->write_byte(0x2004, 0x5A);

    EXPECT_EQ(expected, registers);
}